

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

UBool __thiscall icu_63::MessagePattern::operator==(MessagePattern *this,MessagePattern *other)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  UVar3 = '\x01';
  if (this != other) {
    if (this->aposMode == other->aposMode) {
      uVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar1 & 1) == 0) {
        if ((short)uVar1 < 0) {
          iVar4 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          iVar4 = (int)(short)uVar1 >> 5;
        }
        sVar2 = (other->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar5 = (other->msg).fUnion.fFields.fLength;
        }
        else {
          iVar5 = (int)sVar2 >> 5;
        }
        bVar6 = false;
        if ((((int)sVar2 & 1U) == 0) && (bVar6 = false, iVar4 == iVar5)) {
          UVar3 = UnicodeString::doEquals(&this->msg,&other->msg,iVar4);
          bVar6 = UVar3 != '\0';
        }
      }
      else {
        bVar6 = (bool)(*(byte *)&(other->msg).fUnion & 1);
      }
      if ((bVar6 != false) && (iVar4 = this->partsLength, iVar4 == other->partsLength)) {
        if (iVar4 == 0) {
          return '\x01';
        }
        UVar3 = MessagePatternList<icu_63::MessagePattern::Part,_32>::equals
                          (&this->partsList->
                            super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                           &other->partsList->
                            super_MessagePatternList<icu_63::MessagePattern::Part,_32>,iVar4);
        return UVar3 != '\0';
      }
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool
MessagePattern::operator==(const MessagePattern &other) const {
    if(this==&other) {
        return TRUE;
    }
    return
        aposMode==other.aposMode &&
        msg==other.msg &&
        // parts.equals(o.parts)
        partsLength==other.partsLength &&
        (partsLength==0 || partsList->equals(*other.partsList, partsLength));
    // No need to compare numericValues if msg and parts are the same.
}